

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void fs_file_open_append(int add_flags)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  __off64_t _Var7;
  uv_buf_t *bufs;
  char *pcVar8;
  uv_fs_t *puVar9;
  uv_fs_t *unaff_R14;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uv_buf_t uVar15;
  char acStack_49a [2];
  uv_loop_t *puStack_498;
  uv_buf_t uStack_400;
  uv_buf_t uStack_3f0;
  uv_loop_t *puStack_3d8;
  uv_fs_t *puStack_3d0;
  uv_fs_t *puStack_3c8;
  uv_buf_t uStack_390;
  uv_buf_t uStack_380;
  uv_buf_t uStack_370;
  uv_buf_t uStack_360;
  char acStack_350 [256];
  char acStack_250 [256];
  char acStack_150 [128];
  char acStack_d0 [136];
  uv_loop_t *puStack_48;
  
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fs_file_open_append_cold_1();
LAB_00155034:
    fs_file_open_append_cold_2();
LAB_00155039:
    fs_file_open_append_cold_3();
LAB_0015503e:
    fs_file_open_append_cold_4();
LAB_00155043:
    fs_file_open_append_cold_5();
LAB_00155048:
    fs_file_open_append_cold_6();
LAB_0015504d:
    fs_file_open_append_cold_7();
LAB_00155052:
    fs_file_open_append_cold_8();
LAB_00155057:
    fs_file_open_append_cold_9();
LAB_0015505c:
    fs_file_open_append_cold_10();
LAB_00155061:
    fs_file_open_append_cold_11();
LAB_00155066:
    fs_file_open_append_cold_12();
LAB_0015506b:
    fs_file_open_append_cold_13();
LAB_00155070:
    fs_file_open_append_cold_14();
LAB_00155075:
    fs_file_open_append_cold_15();
LAB_0015507a:
    fs_file_open_append_cold_16();
LAB_0015507f:
    fs_file_open_append_cold_17();
LAB_00155084:
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00155034;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00155039;
    if (write_req.result < 0) goto LAB_0015503e;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155043;
    if (close_req.result != 0) goto LAB_00155048;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x402,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015504d;
    if (open_req1.result._4_4_ < 0) goto LAB_00155052;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(test_buf,0xd);
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00155057;
    if (write_req.result < 0) goto LAB_0015505c;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155061;
    if (close_req.result != 0) goto LAB_00155066;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0x100,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015506b;
    if (open_req1.result._4_4_ < 0) goto LAB_00155070;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(buf,0x20);
    iov = uVar15;
    uVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_00155075;
    if (read_req.result != 0x1a) goto LAB_0015507a;
    auVar14[0] = -(buf[10] == 'r');
    auVar14[1] = -(buf[0xb] == '\n');
    auVar14[2] = -(buf[0xc] == '\0');
    auVar14[3] = -(buf[0xd] == 't');
    auVar14[4] = -(buf[0xe] == 'e');
    auVar14[5] = -(buf[0xf] == 's');
    auVar14[6] = -(buf[0x10] == 't');
    auVar14[7] = -(buf[0x11] == '-');
    auVar14[8] = -(buf[0x12] == 'b');
    auVar14[9] = -(buf[0x13] == 'u');
    auVar14[10] = -(buf[0x14] == 'f');
    auVar14[0xb] = -(buf[0x15] == 'f');
    auVar14[0xc] = -(buf[0x16] == 'e');
    auVar14[0xd] = -(buf[0x17] == 'r');
    auVar14[0xe] = -(buf[0x18] == '\n');
    auVar14[0xf] = -(buf[0x19] == '\0');
    auVar13[0] = -(buf[0] == 't');
    auVar13[1] = -(buf[1] == 'e');
    auVar13[2] = -(buf[2] == 's');
    auVar13[3] = -(buf[3] == 't');
    auVar13[4] = -(buf[4] == '-');
    auVar13[5] = -(buf[5] == 'b');
    auVar13[6] = -(buf[6] == 'u');
    auVar13[7] = -(buf[7] == 'f');
    auVar13[8] = -(buf[8] == 'f');
    auVar13[9] = -(buf[9] == 'e');
    auVar13[10] = -(buf[10] == 'r');
    auVar13[0xb] = -(buf[0xb] == '\n');
    auVar13[0xc] = -(buf[0xc] == '\0');
    auVar13[0xd] = -(buf[0xd] == 't');
    auVar13[0xe] = -(buf[0xe] == 'e');
    auVar13[0xf] = -(buf[0xf] == 's');
    auVar13 = auVar13 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015507f;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155084;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_file_open_append_cold_19();
  unlink("test_file");
  unlink("test_file2");
  loop = uv_default_loop();
  iVar4 = 0;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    run_test_fs_rename_to_existing_file_cold_1();
LAB_001553cf:
    run_test_fs_rename_to_existing_file_cold_2();
LAB_001553d4:
    run_test_fs_rename_to_existing_file_cold_3();
LAB_001553d9:
    run_test_fs_rename_to_existing_file_cold_4();
LAB_001553de:
    run_test_fs_rename_to_existing_file_cold_5();
LAB_001553e3:
    run_test_fs_rename_to_existing_file_cold_6();
LAB_001553e8:
    run_test_fs_rename_to_existing_file_cold_7();
LAB_001553ed:
    run_test_fs_rename_to_existing_file_cold_8();
LAB_001553f2:
    run_test_fs_rename_to_existing_file_cold_9();
LAB_001553f7:
    run_test_fs_rename_to_existing_file_cold_10();
LAB_001553fc:
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00155401:
    run_test_fs_rename_to_existing_file_cold_12();
LAB_00155406:
    run_test_fs_rename_to_existing_file_cold_13();
LAB_0015540b:
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00155410:
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00155415:
    run_test_fs_rename_to_existing_file_cold_16();
LAB_0015541a:
    run_test_fs_rename_to_existing_file_cold_17();
LAB_0015541f:
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00155424:
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001553cf;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001553d4;
    if (write_req.result < 0) goto LAB_001553d9;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001553de;
    if (close_req.result != 0) goto LAB_001553e3;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001553e8;
    if (open_req1.result._4_4_ < 0) goto LAB_001553ed;
    uv_fs_req_cleanup(&open_req1);
    iVar4 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001553f2;
    if (close_req.result != 0) goto LAB_001553f7;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar2 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001553fc;
    if (rename_req.result != 0) goto LAB_00155401;
    uv_fs_req_cleanup(&rename_req);
    iVar4 = 0;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00155406;
    if (open_req1.result._4_4_ < 0) goto LAB_0015540b;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_00155410;
    if (read_req.result < 0) goto LAB_00155415;
    iVar4 = 0x2fbca0;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_0015541a;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015541f;
    if (close_req.result != 0) goto LAB_00155424;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    unlink("test_file2");
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    iVar4 = (int)puVar5;
    if (iVar2 == 0) {
      return;
    }
  }
  run_test_fs_rename_to_existing_file_cold_20();
  fs_read_bufs(iVar4);
  fs_read_bufs(iVar4);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar6 = uv_default_loop();
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_read_bufs_cold_1();
  iVar4 = 0;
  puStack_48 = puVar5;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fs_read_bufs_cold_1();
LAB_001556d5:
    fs_read_bufs_cold_2();
LAB_001556da:
    fs_read_bufs_cold_3();
LAB_001556df:
    fs_read_bufs_cold_4();
LAB_001556e4:
    fs_read_bufs_cold_5();
LAB_001556e9:
    fs_read_bufs_cold_6();
LAB_001556ee:
    fs_read_bufs_cold_7();
LAB_001556f3:
    fs_read_bufs_cold_8();
LAB_001556f8:
    fs_read_bufs_cold_9();
LAB_001556fd:
    fs_read_bufs_cold_10();
LAB_00155702:
    fs_read_bufs_cold_11();
LAB_00155707:
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001556d5;
    uv_fs_req_cleanup(&open_req1);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,0,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001556da;
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,1,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001556df;
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_390,0,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001556e4;
    uStack_390 = uv_buf_init(acStack_350,0x100);
    uStack_380 = uv_buf_init(acStack_250,0x100);
    uStack_370 = uv_buf_init(acStack_150,0x80);
    uStack_360 = uv_buf_init(acStack_d0,0x80);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_390,2,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0x1be) goto LAB_001556e9;
    if (read_req.result != 0x1be) goto LAB_001556ee;
    unaff_R14 = &read_req;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_370,2,0x100,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0xbe) goto LAB_001556f3;
    if (read_req.result != 0xbe) goto LAB_001556f8;
    uv_fs_req_cleanup(&read_req);
    pcVar8 = uStack_380.base;
    pcVar12 = uStack_380.base;
    iVar2 = bcmp(uStack_380.base,uStack_370.base,0x80);
    iVar4 = (int)pcVar12;
    if (iVar2 != 0) goto LAB_001556fd;
    pcVar8 = pcVar8 + 0x80;
    iVar2 = bcmp(pcVar8,uStack_360.base,0x3e);
    iVar4 = (int)pcVar8;
    if (iVar2 != 0) goto LAB_00155702;
    iVar4 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155707;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      return;
    }
  }
  fs_read_bufs_cold_13();
  fs_read_file_eof(iVar4);
  fs_read_file_eof(iVar4);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_read_file_eof_cold_1();
  puVar9 = (uv_fs_t *)0x194385;
  puStack_3c8 = (uv_fs_t *)0x15576d;
  unlink("test_file");
  puStack_3c8 = (uv_fs_t *)0x155772;
  loop = uv_default_loop();
  iVar4 = 0;
  puStack_3c8 = (uv_fs_t *)0x155798;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    puStack_3c8 = (uv_fs_t *)0x1559f5;
    fs_read_file_eof_cold_1();
LAB_001559f5:
    puStack_3c8 = (uv_fs_t *)0x1559fa;
    fs_read_file_eof_cold_2();
LAB_001559fa:
    puStack_3c8 = (uv_fs_t *)0x1559ff;
    fs_read_file_eof_cold_3();
LAB_001559ff:
    puStack_3c8 = (uv_fs_t *)0x155a04;
    fs_read_file_eof_cold_4();
LAB_00155a04:
    puStack_3c8 = (uv_fs_t *)0x155a09;
    fs_read_file_eof_cold_5();
LAB_00155a09:
    puStack_3c8 = (uv_fs_t *)0x155a0e;
    fs_read_file_eof_cold_6();
LAB_00155a0e:
    puStack_3c8 = (uv_fs_t *)0x155a13;
    fs_read_file_eof_cold_7();
LAB_00155a13:
    puStack_3c8 = (uv_fs_t *)0x155a18;
    fs_read_file_eof_cold_8();
LAB_00155a18:
    puStack_3c8 = (uv_fs_t *)0x155a1d;
    fs_read_file_eof_cold_9();
LAB_00155a1d:
    puStack_3c8 = (uv_fs_t *)0x155a22;
    fs_read_file_eof_cold_10();
LAB_00155a22:
    puStack_3c8 = (uv_fs_t *)0x155a27;
    fs_read_file_eof_cold_11();
LAB_00155a27:
    puStack_3c8 = (uv_fs_t *)0x155a2c;
    fs_read_file_eof_cold_12();
LAB_00155a2c:
    puStack_3c8 = (uv_fs_t *)0x155a31;
    fs_read_file_eof_cold_13();
LAB_00155a31:
    puStack_3c8 = (uv_fs_t *)0x155a36;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001559f5;
    puStack_3c8 = (uv_fs_t *)0x1557ba;
    uv_fs_req_cleanup(&open_req1);
    puStack_3c8 = (uv_fs_t *)0x1557cb;
    uVar15 = uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x155809;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001559fa;
    if (write_req.result < 0) goto LAB_001559ff;
    puStack_3c8 = (uv_fs_t *)0x15582b;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x155841;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155a04;
    if (close_req.result != 0) goto LAB_00155a09;
    puStack_3c8 = (uv_fs_t *)0x155863;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x155880;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00155a0e;
    if (open_req1.result._4_4_ < 0) goto LAB_00155a13;
    puStack_3c8 = (uv_fs_t *)0x1558a2;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_3c8 = (uv_fs_t *)0x1558c4;
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x155902;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_00155a18;
    if (read_req.result < 0) goto LAB_00155a1d;
    iVar4 = 0x2fbca0;
    puStack_3c8 = (uv_fs_t *)0x15592b;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00155a22;
    puVar9 = &read_req;
    puStack_3c8 = (uv_fs_t *)0x155942;
    uv_fs_req_cleanup(&read_req);
    puStack_3c8 = (uv_fs_t *)0x155953;
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x15598d;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,read_req.result,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155a27;
    if (read_req.result != 0) goto LAB_00155a2c;
    puStack_3c8 = (uv_fs_t *)0x1559af;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    puStack_3c8 = (uv_fs_t *)0x1559c5;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155a31;
    if (close_req.result == 0) {
      puStack_3c8 = (uv_fs_t *)0x1559df;
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  puStack_3c8 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_3d0 = (uv_fs_t *)0x155a41;
  puStack_3c8 = puVar9;
  fs_write_multiple_bufs(iVar4);
  puStack_3d0 = (uv_fs_t *)0x155a46;
  fs_write_multiple_bufs(iVar4);
  puStack_3d0 = (uv_fs_t *)0x155a4b;
  puVar5 = uv_default_loop();
  puStack_3d0 = (uv_fs_t *)0x155a5f;
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  puStack_3d0 = (uv_fs_t *)0x155a69;
  uv_run(puVar5,UV_RUN_DEFAULT);
  puStack_3d0 = (uv_fs_t *)0x155a6e;
  puVar6 = uv_default_loop();
  puStack_3d0 = (uv_fs_t *)0x155a76;
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    return;
  }
  puStack_3d0 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  puStack_3d8 = puVar5;
  puStack_3d0 = unaff_R14;
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar4 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00155f16:
    fs_write_multiple_bufs_cold_2();
LAB_00155f1b:
    fs_write_multiple_bufs_cold_3();
LAB_00155f20:
    fs_write_multiple_bufs_cold_4();
LAB_00155f25:
    fs_write_multiple_bufs_cold_5();
LAB_00155f2a:
    fs_write_multiple_bufs_cold_6();
LAB_00155f2f:
    fs_write_multiple_bufs_cold_7();
LAB_00155f34:
    fs_write_multiple_bufs_cold_8();
LAB_00155f39:
    fs_write_multiple_bufs_cold_9();
LAB_00155f3e:
    fs_write_multiple_bufs_cold_10();
LAB_00155f43:
    fs_write_multiple_bufs_cold_11();
LAB_00155f48:
    fs_write_multiple_bufs_cold_12();
LAB_00155f4d:
    fs_write_multiple_bufs_cold_13();
LAB_00155f52:
    fs_write_multiple_bufs_cold_14();
LAB_00155f57:
    fs_write_multiple_bufs_cold_15();
LAB_00155f5c:
    fs_write_multiple_bufs_cold_16();
LAB_00155f61:
    fs_write_multiple_bufs_cold_19();
LAB_00155f66:
    fs_write_multiple_bufs_cold_20();
LAB_00155f6b:
    fs_write_multiple_bufs_cold_21();
LAB_00155f70:
    fs_write_multiple_bufs_cold_22();
LAB_00155f75:
    fs_write_multiple_bufs_cold_23();
LAB_00155f7a:
    fs_write_multiple_bufs_cold_24();
LAB_00155f7f:
    fs_write_multiple_bufs_cold_25();
LAB_00155f84:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00155f16;
    uv_fs_req_cleanup(&open_req1);
    uStack_400 = uv_buf_init(test_buf,0xd);
    uStack_3f0 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&uStack_400,2,0,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155f1b;
    if (write_req.result < 0) goto LAB_00155f20;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_00155f25;
    if (close_req.result != 0) goto LAB_00155f2a;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155f2f;
    if (open_req1.result._4_4_ < 0) goto LAB_00155f34;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    uStack_400 = uv_buf_init(buf,0xd);
    uStack_3f0 = uv_buf_init(buf2,0xf);
    iVar2 = (uv_file)open_req1.result;
    _Var7 = lseek64((uv_file)open_req1.result,0,1);
    if (_Var7 != 0) goto LAB_00155f39;
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_400,2,-1,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155f3e;
    if (read_req.result != 0x1c) goto LAB_00155f43;
    iVar2 = 0x2fbca0;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_00155f48;
    iVar2 = 0x2fd090;
    iVar4 = strcmp(buf2,test_buf2);
    if (iVar4 != 0) goto LAB_00155f4d;
    uv_fs_req_cleanup(&read_req);
    uVar15 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar15;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar4 != 0) goto LAB_00155f52;
    if (read_req.result != 0) goto LAB_00155f57;
    uv_fs_req_cleanup(&read_req);
    uStack_400 = uv_buf_init(buf,0xd);
    uStack_3f0 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_400,2,0,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155f5c;
    if (read_req.result == 0x1c) {
LAB_00155e14:
      iVar2 = 0x2fbca0;
      iVar4 = strcmp(buf,test_buf);
      if (iVar4 != 0) goto LAB_00155f61;
      iVar2 = 0x2fd090;
      iVar4 = strcmp(buf2,test_buf2);
      if (iVar4 != 0) goto LAB_00155f66;
      uv_fs_req_cleanup(&read_req);
      uVar15 = uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar15;
      iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0x1c,
                         (uv_fs_cb)0x0);
      if (iVar4 != 0) goto LAB_00155f6b;
      if (read_req.result != 0) goto LAB_00155f70;
      uv_fs_req_cleanup(&read_req);
      iVar2 = 0;
      iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
      if (iVar4 != 0) goto LAB_00155f75;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_00155f7a;
    }
    if (read_req.result != 0xd) goto LAB_00155f7f;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_3f0,1,
                       read_req.result,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155f84;
    if (read_req.result == 0xf) goto LAB_00155e14;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0xd4310;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_00156306:
    fs_write_alotof_bufs_cold_18();
LAB_0015630b:
    fs_write_alotof_bufs_cold_1();
LAB_00156310:
    fs_write_alotof_bufs_cold_2();
LAB_00156315:
    fs_write_alotof_bufs_cold_3();
LAB_0015631a:
    fs_write_alotof_bufs_cold_4();
LAB_0015631f:
    fs_write_alotof_bufs_cold_17();
LAB_00156324:
    fs_write_alotof_bufs_cold_5();
LAB_00156329:
    fs_write_alotof_bufs_cold_6();
LAB_0015632e:
    fs_write_alotof_bufs_cold_7();
LAB_00156333:
    fs_write_alotof_bufs_cold_8();
LAB_00156338:
    fs_write_alotof_bufs_cold_9();
LAB_0015633d:
    fs_write_alotof_bufs_cold_10();
LAB_00156342:
    fs_write_alotof_bufs_cold_12();
LAB_00156347:
    fs_write_alotof_bufs_cold_13();
LAB_0015634c:
    fs_write_alotof_bufs_cold_14();
LAB_00156351:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015630b;
    if (open_req1.result._4_4_ < 0) goto LAB_00156310;
    uv_fs_req_cleanup(&open_req1);
    lVar11 = 8;
    do {
      uVar15 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar11 + -8) = uVar15.base;
      *(size_t *)((long)&bufs->base + lVar11) = uVar15.len;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00156315;
    if (write_req.result != 0xac67d) goto LAB_0015631a;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_0015631f;
    lVar11 = 8;
    pcVar12 = pcVar8;
    do {
      uVar15 = uv_buf_init(pcVar12,0xd);
      *(char **)((long)bufs + lVar11 + -8) = uVar15.base;
      *(size_t *)((long)&bufs->base + lVar11) = uVar15.len;
      lVar11 = lVar11 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar11 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_00156324;
    if (close_req.result != 0) goto LAB_00156329;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015632e;
    if (open_req1.result._4_4_ < 0) goto LAB_00156333;
    uv_fs_req_cleanup(&open_req1);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00156338;
    if (read_req.result != 0x3400) goto LAB_0015633d;
    lVar11 = 0;
    do {
      pcVar12 = pcVar8 + lVar11;
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      iVar2 = (int)pcVar12;
      if (iVar4 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00156306;
      }
      lVar11 = lVar11 + 0xd;
    } while (lVar11 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pcVar8);
    iVar2 = (uv_file)open_req1.result;
    _Var7 = lseek64((uv_file)open_req1.result,write_req.result,0);
    if (_Var7 != write_req.result) goto LAB_00156342;
    uVar15 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar15;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar4 != 0) goto LAB_00156347;
    if (read_req.result != 0) goto LAB_0015634c;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_00156351;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(bufs);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar6 = uv_default_loop();
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_498 = (uv_loop_t *)0x1563bd;
  unlink("test_file");
  puStack_498 = (uv_loop_t *)0x1563c2;
  loop = uv_default_loop();
  puStack_498 = (uv_loop_t *)0x1563d3;
  puVar6 = (uv_loop_t *)malloc(0xd4310);
  if (puVar6 == (uv_loop_t *)0x0) {
LAB_0015671f:
    puVar6 = puVar5;
    puStack_498 = (uv_loop_t *)0x156724;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00156724:
    puStack_498 = (uv_loop_t *)0x156729;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00156729:
    puStack_498 = (uv_loop_t *)0x15672e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015672e:
    puStack_498 = (uv_loop_t *)0x156733;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00156733:
    puStack_498 = (uv_loop_t *)0x156738;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00156738:
    puStack_498 = (uv_loop_t *)0x15673d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_0015673d:
    puStack_498 = (uv_loop_t *)0x156742;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00156742:
    puStack_498 = (uv_loop_t *)0x156747;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00156747:
    puStack_498 = (uv_loop_t *)0x15674c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_0015674c:
    puStack_498 = (uv_loop_t *)0x156751;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00156751:
    puStack_498 = (uv_loop_t *)0x156756;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00156756:
    puStack_498 = (uv_loop_t *)0x15675b;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0015675b:
    puStack_498 = (uv_loop_t *)0x156760;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00156760:
    puStack_498 = (uv_loop_t *)0x156765;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00156765:
    puStack_498 = (uv_loop_t *)0x15676a;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_498 = (uv_loop_t *)0x156402;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156724;
    if (open_req1.result._4_4_ < 0) goto LAB_00156729;
    puStack_498 = (uv_loop_t *)0x156424;
    uv_fs_req_cleanup(&open_req1);
    puStack_498 = (uv_loop_t *)0x156435;
    uVar15 = uv_buf_init("0123456789",10);
    puStack_498 = (uv_loop_t *)0x156473;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015672e;
    if (write_req.result != 10) goto LAB_00156733;
    puStack_498 = (uv_loop_t *)0x156498;
    uv_fs_req_cleanup(&write_req);
    lVar11 = 8;
    do {
      puStack_498 = (uv_loop_t *)0x1564b2;
      uVar15 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar6->handle_queue + lVar11 + -0x18) = uVar15.base;
      *(size_t *)((long)puVar6->handle_queue + lVar11 + -0x10) = uVar15.len;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0xd4318);
    puStack_498 = (uv_loop_t *)0x1564f3;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar6,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156738;
    if (write_req.result != 0xac67d) goto LAB_0015673d;
    puStack_498 = (uv_loop_t *)0x156518;
    uv_fs_req_cleanup(&write_req);
    puStack_498 = (uv_loop_t *)0x156522;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_00156742;
    lVar11 = 8;
    pcVar12 = pcVar8;
    do {
      puStack_498 = (uv_loop_t *)0x156544;
      uVar15 = uv_buf_init(pcVar12,0xd);
      *(char **)((long)puVar6->handle_queue + lVar11 + -0x18) = uVar15.base;
      *(size_t *)((long)puVar6->handle_queue + lVar11 + -0x10) = uVar15.len;
      lVar11 = lVar11 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar11 != 0xd4318);
    puStack_498 = (uv_loop_t *)0x156586;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar6,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156747;
    lVar11 = 0xd;
    if (iVar2 != 0xd) {
      lVar11 = 0x3400;
    }
    if (read_req.result != lVar11) goto LAB_0015674c;
    pcVar12 = pcVar8;
    uVar10 = 0;
    do {
      puStack_498 = (uv_loop_t *)0x1565d0;
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      if (iVar4 != 0) {
        puStack_498 = (uv_loop_t *)0x15671f;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar5 = puVar6;
        goto LAB_0015671f;
      }
      if (iVar2 == 0xd) break;
      pcVar12 = pcVar12 + 0xd;
      bVar1 = uVar10 < 0x3ff;
      uVar10 = uVar10 + 1;
    } while (bVar1);
    puStack_498 = (uv_loop_t *)0x1565fd;
    uv_fs_req_cleanup(&read_req);
    puStack_498 = (uv_loop_t *)0x156605;
    free(pcVar8);
    puStack_498 = (uv_loop_t *)0x15661c;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156751;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00156756;
    puStack_498 = (uv_loop_t *)0x156650;
    uv_fs_req_cleanup(&stat_req);
    puStack_498 = (uv_loop_t *)0x156661;
    uVar15 = uv_buf_init(buf,0x20);
    puStack_498 = (uv_loop_t *)0x1566a2;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015675b;
    if (read_req.result != 0) goto LAB_00156760;
    puStack_498 = (uv_loop_t *)0x1566c4;
    uv_fs_req_cleanup(&read_req);
    puStack_498 = (uv_loop_t *)0x1566da;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156765;
    if (close_req.result == 0) {
      puStack_498 = (uv_loop_t *)0x1566f8;
      uv_fs_req_cleanup(&close_req);
      puStack_498 = (uv_loop_t *)0x156704;
      unlink("test_file");
      free(puVar6);
      return;
    }
  }
  puStack_498 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_498 = puVar6;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_001568e1;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001568e6;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(acStack_49a,2);
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_001568eb;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar2 = uv_loop_close(puVar5);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_001568f5;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_001568e1:
    run_test_fs_read_dir_cold_2();
LAB_001568e6:
    run_test_fs_read_dir_cold_3();
LAB_001568eb:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001568f5:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_file_open_append(int add_flags) {
  int r;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_WRONLY | O_CREAT | add_flags, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_RDWR | O_APPEND | add_flags, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags,
      S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  printf("read = %d\n", r);
  ASSERT(r == 26);
  ASSERT(read_req.result == 26);
  ASSERT(memcmp(buf,
                "test-buffer\n\0test-buffer\n\0",
                sizeof("test-buffer\n\0test-buffer\n\0") - 1) == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
}